

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.c
# Opt level: O0

void * matras_touch(matras *m,matras_id_t id)

{
  _Bool _Var1;
  matras_id_t id_local;
  matras *m_local;
  
  if ((ulong)id < (m->head).block_count) {
    _Var1 = matras_needs_touch(m,id);
    if (_Var1) {
      m_local = (matras *)matras_touch_no_check(m,id);
    }
    else {
      m_local = (matras *)matras_get(m,id);
    }
    return m_local;
  }
  __assert_fail("id < m->head.block_count",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/matras.c"
                ,0x1fe,"void *matras_touch(struct matras *, matras_id_t)");
}

Assistant:

void *
matras_touch(struct matras *m, matras_id_t id)
{
	assert(id < m->head.block_count);

	if (!matras_needs_touch(m, id))
		return matras_get(m, id);

	return matras_touch_no_check(m, id);
}